

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

void __thiscall
tlx::CmdlineParser::print_param_error
          (CmdlineParser *this,int argc,char **argv,Argument *arg,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined4 extraout_var;
  long *plVar4;
  char *pcVar5;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Error: argument ",0x10);
  if (argc != 0) {
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
    pcVar5 = *argv;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
    }
    local_50._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_50,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," for ",5);
  iVar1 = (*arg->_vptr_Argument[2])(arg);
  pcVar5 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," parameter ",0xb);
  Argument::param_text_abi_cxx11_(&local_50,arg);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                          local_50._M_dataplus._M_p._0_1_),local_50._M_string_length
                     );
  pcVar5 = " is invalid!";
  if (argc == 0) {
    pcVar5 = " is missing!";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  print_usage(this,os);
  return;
}

Assistant:

void CmdlineParser::print_param_error(
    int argc, const char* const* argv, const Argument* arg, std::ostream& os) {
    os << "Error: argument ";
    if (argc != 0)
        os << '"' << argv[0] << '"';

    os << " for " << arg->type_name() << " parameter " << arg->param_text()
       << (argc == 0 ? " is missing!" : " is invalid!") << std::endl
       << std::endl;

    print_usage(os);
}